

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O0

exr_result_t
exr_attr_list_add_by_type
          (exr_context_t ctxt,exr_attribute_list_t *list,char *name,char *type,int32_t data_len,
          uint8_t **data_ptr,exr_attribute_t **attr)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  int iVar5;
  size_t sVar6;
  char *in_RCX;
  exr_attribute_t **in_RDX;
  exr_context_t in_RSI;
  long in_RDI;
  int32_t in_R8D;
  exr_context_t in_R9;
  int32_t unaff_retaddr;
  long *in_stack_00000008;
  int32_t in_stack_00000010;
  int i;
  exr_attribute_t *nattr;
  size_t slen;
  int32_t mlen;
  int32_t tlen;
  int32_t nlen;
  exr_result_t rval;
  _internal_exr_attr_map *known;
  exr_attribute_t **in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int32_t in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  long lVar8;
  exr_context_t in_stack_ffffffffffffffa8;
  undefined4 uVar9;
  _internal_exr_attr_map *list_00;
  exr_result_t local_4;
  
  list_00 = (_internal_exr_attr_map *)0x0;
  lVar8 = 0;
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else if ((in_RCX == (char *)0x0) || (*in_RCX == '\0')) {
    local_4 = (**(code **)(in_RDI + 0x40))(in_RDI,3,"Invalid type to add_by_type");
  }
  else {
    local_4 = validate_attr_arguments
                        (in_stack_ffffffffffffffa8,(exr_attribute_list_t *)0x0,
                         (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         in_stack_ffffffffffffff94,
                         (uint8_t **)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         in_stack_ffffffffffffff80);
    if (local_4 == 0) {
      sVar6 = strlen((char *)in_RDX);
      uVar2 = (uint)*(byte *)(in_RDI + 2);
      if ((ulong)(long)(int)uVar2 < sVar6) {
        local_4 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,0xc,"Provided name \'%s\' too long for file (len %d, max %d)",
                             in_RDX,sVar6 & 0xffffffff,uVar2);
      }
      else {
        uVar3 = (uint)sVar6;
        sVar6 = strlen(in_RCX);
        if ((ulong)(long)(int)uVar2 < sVar6) {
          local_4 = (**(code **)(in_RDI + 0x48))
                              (in_RDI,0xc,
                               "Provided type name \'%s\' too long for file (len %d, max %d)",in_RCX
                               ,sVar6 & 0xffffffff,uVar2);
        }
        else {
          uVar4 = (undefined4)sVar6;
          for (iVar1 = 0; iVar1 < the_predefined_attr_count; iVar1 = iVar1 + 1) {
            iVar5 = strcmp(in_RCX,the_predefined_attr_typenames[iVar1].name);
            if (iVar5 == 0) {
              list_00 = the_predefined_attr_typenames + iVar1;
              break;
            }
          }
          if (list_00 == (_internal_exr_attr_map *)0x0) {
            uVar9 = uVar4;
            local_4 = create_attr_block(in_RSI,in_RDX,(size_t)in_RCX,in_R8D,(uint8_t **)in_R9,
                                        (char *)0x0,unaff_retaddr,(char *)in_stack_00000008,
                                        in_stack_00000010);
            uVar7 = uVar4;
            if (local_4 == 0) {
              *(undefined4 *)(lVar8 + 0x14) = 0x1e;
            }
          }
          else {
            uVar7 = 0;
            local_4 = create_attr_block(in_RSI,in_RDX,(size_t)in_RCX,in_R8D,(uint8_t **)in_R9,
                                        (char *)list_00,unaff_retaddr,(char *)in_stack_00000008,
                                        in_stack_00000010);
            uVar9 = uVar4;
            if (local_4 == 0) {
              *(char **)(lVar8 + 8) = list_00->name;
              *(char *)(lVar8 + 0x11) = (char)list_00->name_len;
              *(exr_attribute_type_t *)(lVar8 + 0x14) = list_00->type;
            }
          }
          if (local_4 == 0) {
            local_4 = add_to_list(in_R9,(exr_attribute_list_t *)list_00,
                                  (exr_attribute_t *)(ulong)uVar3,(char *)CONCAT44(uVar9,uVar2));
          }
          if (local_4 == 0) {
            *in_stack_00000008 = lVar8;
            check_attr_handler((exr_context_t)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                               (exr_attribute_t *)CONCAT44(in_stack_ffffffffffffff8c,uVar7));
          }
          else if (in_R9 != (exr_context_t)0x0) {
            in_R9->mode = '\0';
            in_R9->version = '\0';
            in_R9->max_name_length = '\0';
            in_R9->is_singlepart_tiled = '\0';
            in_R9->has_nonimage_data = '\0';
            in_R9->is_multipart = '\0';
            in_R9->strict_header = '\0';
            in_R9->silent_header = '\0';
          }
        }
      }
    }
    else if (local_4 < 0) {
      iVar1 = strcmp(in_RCX,*(char **)(*in_stack_00000008 + 8));
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        lVar8 = *in_stack_00000008;
        *in_stack_00000008 = 0;
        local_4 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,3,
                             "Entry \'%s\' already in list but with different type (\'%s\' vs requested \'%s\')"
                             ,in_RDX,*(undefined8 *)(lVar8 + 8),in_RCX);
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_list_add_by_type (
    exr_context_t         ctxt,
    exr_attribute_list_t* list,
    const char*           name,
    const char*           type,
    int32_t               data_len,
    uint8_t**             data_ptr,
    exr_attribute_t**     attr)
{
    const struct _internal_exr_attr_map* known = NULL;

    exr_result_t     rval = EXR_ERR_INVALID_ARGUMENT;
    int32_t          nlen, tlen, mlen;
    size_t           slen;
    exr_attribute_t* nattr = NULL;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!type || type[0] == '\0')
    {
        return ctxt->report_error (
            ctxt, EXR_ERR_INVALID_ARGUMENT, "Invalid type to add_by_type");
    }

    rval = validate_attr_arguments (ctxt, list, name, data_len, data_ptr, attr);
    if (rval != EXR_ERR_SUCCESS)
    {
        if (rval < 0)
        {
            if (0 != strcmp (type, (*attr)->type_name))
            {
                nattr = *attr;
                *attr = NULL;
                return ctxt->print_error (
                    ctxt,
                    EXR_ERR_INVALID_ARGUMENT,
                    "Entry '%s' already in list but with different type ('%s' vs requested '%s')",
                    name,
                    nattr->type_name,
                    type);
            }
            return EXR_ERR_SUCCESS;
        }
        return rval;
    }

    slen = strlen (name);
    mlen = (int32_t) ctxt->max_name_length;

    if (slen > (size_t) mlen)
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_NAME_TOO_LONG,
            "Provided name '%s' too long for file (len %d, max %d)",
            name,
            (int) slen,
            mlen);
    }
    nlen = (int32_t) slen;

    slen = strlen (type);
    if (slen > (size_t) mlen)
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_NAME_TOO_LONG,
            "Provided type name '%s' too long for file (len %d, max %d)",
            type,
            (int) slen,
            mlen);
    }
    tlen = (int32_t) slen;

    for (int i = 0; i < the_predefined_attr_count; ++i)
    {
        if (0 == strcmp (type, the_predefined_attr_typenames[i].name))
        {
            known = &(the_predefined_attr_typenames[i]);
            break;
        }
    }

    if (known)
    {
        rval = create_attr_block (
            ctxt,
            &nattr,
            known->exp_size,
            data_len,
            data_ptr,
            name,
            nlen,
            NULL,
            0);

        if (rval == EXR_ERR_SUCCESS)
        {
            nattr->type_name        = known->name;
            nattr->type_name_length = (uint8_t) known->name_len;
            nattr->type             = known->type;
        }
    }
    else
    {
        rval = create_attr_block (
            ctxt,
            &nattr,
            sizeof (exr_attr_opaquedata_t),
            data_len,
            data_ptr,
            name,
            nlen,
            type,
            tlen);

        if (rval == EXR_ERR_SUCCESS) nattr->type = EXR_ATTR_OPAQUE;
    }
    if (rval == EXR_ERR_SUCCESS) rval = add_to_list (ctxt, list, nattr, name);
    if (rval == EXR_ERR_SUCCESS)
    {
        *attr = nattr;
        check_attr_handler (ctxt, nattr);
    }
    else if (data_ptr)
        *data_ptr = NULL;

    return rval;
}